

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void idx2::Resize<idx2::array<idx2::v3<int>>>
               (array<idx2::array<idx2::v3<int>_>_> *Array,i64 NewSize)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  array<idx2::v3<int>_> local_78;
  i64 local_48;
  i64 NewSize_local;
  array<idx2::array<idx2::v3<int>_>_> *Array_local;
  i64 local_30;
  allocator *local_28;
  array<idx2::v3<int>_> *local_20;
  allocator *local_18;
  array<idx2::v3<int>_> *local_10;
  
  local_48 = NewSize;
  NewSize_local = (i64)Array;
  if (Array->Capacity < NewSize) {
    GrowCapacity<idx2::array<idx2::v3<int>>>(Array,NewSize);
  }
  if (*(long *)(NewSize_local + 0x18) < local_48) {
    local_30 = NewSize_local;
    lVar1 = *(long *)NewSize_local;
    lVar2 = *(long *)(NewSize_local + 0x18);
    Array_local = (array<idx2::array<idx2::v3<int>_>_> *)NewSize_local;
    lVar3 = *(long *)NewSize_local;
    lVar4 = local_48 * 0x30;
    local_28 = &Mallocator()->super_allocator;
    local_20 = &local_78;
    local_18 = &Mallocator()->super_allocator;
    local_78.Buffer.Data = (byte *)0x0;
    local_78.Buffer.Bytes = 0;
    local_78.Size = 0;
    local_78.Capacity = 0;
    local_78.Alloc = local_28;
    local_10 = &local_78;
    local_78.Buffer.Alloc = local_18;
    Fill<idx2::array<idx2::v3<int>>*,idx2::array<idx2::v3<int>>>
              ((array<idx2::v3<int>_> *)(lVar1 + lVar2 * 0x30),
               (array<idx2::v3<int>_> *)(lVar3 + lVar4),&local_78);
  }
  *(i64 *)(NewSize_local + 0x18) = local_48;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}